

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

ConstantValue *
slang::ast::Bitstream::reOrder(ConstantValue *value,uint64_t sliceSize,uint64_t unpackWidth)

{
  anon_class_24_3_4aefb7ac *paVar1;
  bool bVar2;
  size_type sVar3;
  anon_class_24_3_4aefb7ac *this;
  unsigned_long *__n;
  PackIterator iterEnd;
  anon_class_24_3_4aefb7ac *width_00;
  anon_class_24_3_4aefb7ac *bit_00;
  PackIterator ppCVar4;
  ConstantValue *this_00;
  uint64_t in_RCX;
  anon_class_24_3_4aefb7ac *in_RDX;
  ConstantValue *in_RDI;
  size_t i;
  const_iterator iter;
  size_t nextIndex;
  uint64_t bit;
  const_iterator iter_1;
  uint64_t slice;
  uint64_t width;
  size_t index;
  anon_class_24_3_4aefb7ac sliceOrAppend;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> result;
  uint64_t trimWidth;
  uint64_t extraBits;
  uint64_t rightWidth;
  size_t rightIndex;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  uint64_t numBlocks;
  uint64_t totalWidth;
  ConstantValue *in_stack_fffffffffffffe58;
  ConstantValue *in_stack_fffffffffffffe60;
  ConstantValue *in_stack_fffffffffffffe68;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffe70;
  anon_class_24_3_4aefb7ac *in_stack_fffffffffffffe90;
  reference in_stack_fffffffffffffe98;
  uint64_t local_140;
  PackIterator local_128;
  SmallVectorBase<slang::ConstantValue_*> *in_stack_ffffffffffffff08;
  pointer *ppCVar5;
  ConstantValue *in_stack_ffffffffffffff10;
  anon_class_24_3_4aefb7ac **iter_00;
  size_type local_c0 [4];
  anon_class_24_3_4aefb7ac *local_a0;
  anon_class_24_3_4aefb7ac *local_98;
  anon_class_24_3_4aefb7ac *local_90;
  PackIterator local_88;
  undefined4 local_80;
  SmallVectorBase<slang::ConstantValue_*> local_70 [2];
  ulong local_30;
  uint64_t local_28;
  uint64_t local_20;
  anon_class_24_3_4aefb7ac *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = slang::ConstantValue::getBitstreamWidth((ConstantValue *)in_stack_ffffffffffffff08);
  local_140 = local_28;
  if (local_20 != 0) {
    local_140 = local_20;
  }
  local_30 = ((long)local_18 + (local_140 - 1)) / (ulong)local_18;
  if (local_30 < 2) {
    slang::ConstantValue::ConstantValue(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  }
  else {
    SmallVector<slang::ConstantValue_*,_5UL>::SmallVector
              ((SmallVector<slang::ConstantValue_*,_5UL> *)0x115813b);
    packBitstream(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    bVar2 = SmallVectorBase<slang::ConstantValue_*>::empty(local_70);
    if (bVar2) {
      slang::ConstantValue::ConstantValue(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_80 = 1;
    }
    else {
      sVar3 = SmallVectorBase<slang::ConstantValue_*>::size(local_70);
      local_88 = (PackIterator)(sVar3 - 1);
      SmallVectorBase<slang::ConstantValue_*>::back(local_70);
      this = (anon_class_24_3_4aefb7ac *)
             slang::ConstantValue::getBitstreamWidth((ConstantValue *)in_stack_ffffffffffffff08);
      local_98 = (anon_class_24_3_4aefb7ac *)0x0;
      local_90 = this;
      if (local_20 != 0) {
        if (local_20 < local_28) {
          local_a0 = (anon_class_24_3_4aefb7ac *)(local_28 - local_20);
          while (local_90 <= local_a0) {
            local_88 = (PackIterator)((long)local_88 - 1);
            local_a0 = (anon_class_24_3_4aefb7ac *)((long)local_a0 - (long)local_90);
            in_stack_fffffffffffffe98 =
                 SmallVectorBase<slang::ConstantValue_*>::operator[](local_70,(size_type)local_88);
            in_stack_fffffffffffffe90 =
                 (anon_class_24_3_4aefb7ac *)
                 slang::ConstantValue::getBitstreamWidth((ConstantValue *)in_stack_ffffffffffffff08)
            ;
            local_90 = in_stack_fffffffffffffe90;
          }
          local_90 = (anon_class_24_3_4aefb7ac *)((long)local_90 - (long)local_a0);
        }
        local_98 = (anon_class_24_3_4aefb7ac *)(local_20 % (ulong)local_18);
      }
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0x11582f8);
      local_c0[0] = SmallVectorBase<slang::ConstantValue_*>::size(local_70);
      __n = std::max<unsigned_long>(local_c0,&local_30);
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                 in_stack_fffffffffffffe90,(size_type)__n);
      iter_00 = &local_90;
      for (; paVar1 = local_98, 1 < local_30; local_30 = local_30 - 1) {
        width_00 = local_18;
        bit_00 = local_90;
        iterEnd = local_88;
        if (local_98 != (anon_class_24_3_4aefb7ac *)0x0) {
          local_98 = (anon_class_24_3_4aefb7ac *)0x0;
          width_00 = paVar1;
        }
        while (bit_00 <= width_00) {
          iterEnd = (PackIterator)((long)iterEnd - 1);
          width_00 = (anon_class_24_3_4aefb7ac *)((long)width_00 - (long)bit_00);
          SmallVectorBase<slang::ConstantValue_*>::operator[](local_70,(size_type)iterEnd);
          bit_00 = (anon_class_24_3_4aefb7ac *)
                   slang::ConstantValue::getBitstreamWidth
                             ((ConstantValue *)in_stack_ffffffffffffff08);
        }
        in_stack_fffffffffffffe70 =
             (vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
             std::cbegin<slang::SmallVector<slang::ConstantValue*,5ul>>
                       ((SmallVector<slang::ConstantValue_*,_5UL> *)0x115847f);
        ppCVar5 = &(in_stack_fffffffffffffe70->
                   super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   _M_impl.super__Vector_impl_data._M_start + (long)iterEnd;
        if (width_00 != (anon_class_24_3_4aefb7ac *)0x0) {
          in_stack_fffffffffffffe68 =
               (ConstantValue *)
               std::cend<slang::SmallVector<slang::ConstantValue*,5ul>>
                         ((SmallVector<slang::ConstantValue_*,_5UL> *)0x11584d9);
          slicePacked((PackIterator *)iter_00,iterEnd,(uint64_t *)bit_00,(uint64_t)width_00);
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::SVInt>(in_stack_fffffffffffffe70,(SVInt *)in_stack_fffffffffffffe68);
          SVInt::~SVInt((SVInt *)in_stack_fffffffffffffe70);
          bit_00 = (anon_class_24_3_4aefb7ac *)((long)bit_00 - (long)width_00);
        }
        in_stack_ffffffffffffff08 = (SmallVectorBase<slang::ConstantValue_*> *)(ppCVar5 + 1);
        ppCVar4 = iterEnd;
        while (ppCVar4 = (PackIterator)((long)ppCVar4 + 1), ppCVar4 < local_88) {
          in_stack_ffffffffffffff08 =
               (SmallVectorBase<slang::ConstantValue_*> *)&in_stack_ffffffffffffff08->len;
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::ConstantValue>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        }
        if (ppCVar4 == local_88) {
          reOrder::anon_class_24_3_4aefb7ac::operator()(this,in_stack_fffffffffffffe98);
        }
        local_90 = bit_00;
        local_88 = iterEnd;
      }
      this_00 = (ConstantValue *)
                std::cbegin<slang::SmallVector<slang::ConstantValue*,5ul>>
                          ((SmallVector<slang::ConstantValue_*,_5UL> *)0x1158651);
      for (local_128 = (PackIterator)0x0; local_128 < local_88;
          local_128 = (PackIterator)((long)local_128 + 1)) {
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
        emplace_back<slang::ConstantValue>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      }
      reOrder::anon_class_24_3_4aefb7ac::operator()(this,in_stack_fffffffffffffe98);
      slang::ConstantValue::ConstantValue(this_00,(Elements *)in_stack_fffffffffffffe58);
      local_80 = 1;
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                (in_stack_fffffffffffffe70);
    }
    SmallVector<slang::ConstantValue_*,_5UL>::~SmallVector
              ((SmallVector<slang::ConstantValue_*,_5UL> *)0x1158725);
  }
  return in_RDI;
}

Assistant:

ConstantValue Bitstream::reOrder(ConstantValue&& value, uint64_t sliceSize, uint64_t unpackWidth) {
    uint64_t totalWidth = value.getBitstreamWidth();
    SLANG_ASSERT(unpackWidth <= totalWidth);

    uint64_t numBlocks = ((unpackWidth ? unpackWidth : totalWidth) + sliceSize - 1) / sliceSize;
    if (numBlocks <= 1)
        return std::move(value);

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);
    if (packed.empty())
        return std::move(value);

    size_t rightIndex = packed.size() - 1; // Right-to-left
    uint64_t rightWidth = packed.back()->getBitstreamWidth();
    uint64_t extraBits = 0;

    if (unpackWidth) {
        if (unpackWidth < totalWidth) { // left-aligned so trim rightmost
            auto trimWidth = totalWidth - unpackWidth;
            while (trimWidth >= rightWidth) {
                rightIndex--;
                trimWidth -= rightWidth;
                rightWidth = packed[rightIndex]->getBitstreamWidth();
            }
            rightWidth -= trimWidth;
        }

        // For unpack, extraBits is for the first block.
        // For pack, extraBits is for the last block.
        extraBits = unpackWidth % sliceSize;
    }

    std::vector<ConstantValue> result;
    result.reserve(std::max<size_t>(packed.size(), numBlocks));
    auto sliceOrAppend = [&](PackIterator iter) {
        if (rightWidth == (*iter)->getBitstreamWidth())
            result.emplace_back(std::move(**iter));
        else {
            uint64_t bit = 0;
            result.emplace_back(slicePacked(iter, std::cend(packed), bit, rightWidth));
        }
    };

    while (numBlocks > 1) {
        size_t index = rightIndex;
        uint64_t width = rightWidth;
        uint64_t slice = sliceSize;
        if (extraBits) {
            slice = extraBits;
            extraBits = 0;
        }
        while (slice >= width) {
            index--;
            slice -= width;
            width = packed[index]->getBitstreamWidth();
        }

        // A block composed of bits from the last "slice" bits of packed[index] to the first
        // "rightWidth" bits of packed[rightIndex].
        auto iter = std::cbegin(packed) + index;
        if (slice) {
            auto bit = width - slice;
            result.emplace_back(slicePacked(iter, std::cend(packed), bit, slice));
            width -= slice;
        }

        iter++;
        auto nextIndex = index;
        while (++index < rightIndex)
            result.emplace_back(std::move(**iter++));

        if (index == rightIndex)
            sliceOrAppend(iter);

        rightIndex = nextIndex;
        rightWidth = width;
        numBlocks--;
    }

    // For pack, the last block may be smaller than slice size.
    auto iter = std::cbegin(packed);
    for (size_t i = 0; i < rightIndex; i++)
        result.emplace_back(std::move(**iter++));
    sliceOrAppend(iter);

    return result;
}